

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_storage.cpp
# Opt level: O3

ErrorData * __thiscall
duckdb::LocalTableStorage::AppendToIndexes
          (ErrorData *__return_storage_ptr__,LocalTableStorage *this,DuckTransaction *transaction,
          RowGroupCollection *source,TableIndexList *index_list,
          vector<duckdb::LogicalType,_true> *table_types,row_t *start_row)

{
  DataChunk mock_chunk;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  index_columns;
  vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_> local_f8;
  RowGroupCollection *local_d8;
  DuckTransaction *local_d0;
  _Any_data local_c8;
  code *local_b8;
  code *local_b0;
  DataChunk local_a8;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  local_d8 = source;
  local_d0 = transaction;
  TableIndexList::GetRequiredColumns
            ((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
              *)&local_68,index_list);
  local_f8.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (; local_68._M_before_begin._M_nxt != (_Hash_node_base *)0x0;
      local_68._M_before_begin._M_nxt = (local_68._M_before_begin._M_nxt)->_M_nxt) {
    ::std::vector<duckdb::StorageIndex,std::allocator<duckdb::StorageIndex>>::
    emplace_back<unsigned_long_const&>
              ((vector<duckdb::StorageIndex,std::allocator<duckdb::StorageIndex>> *)&local_f8,
               (unsigned_long *)(local_68._M_before_begin._M_nxt + 1));
  }
  DataChunk::DataChunk(&local_a8);
  DataChunk::InitializeEmpty(&local_a8,table_types);
  ErrorData::ErrorData(__return_storage_ptr__);
  local_c8._8_8_ = 0;
  local_c8._M_unused._M_object = operator_new(0x30);
  *(vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_> **)local_c8._M_unused._0_8_
       = &local_f8;
  *(DataChunk **)((long)local_c8._M_unused._0_8_ + 8) = &local_a8;
  *(ErrorData **)((long)local_c8._M_unused._0_8_ + 0x10) = __return_storage_ptr__;
  *(TableIndexList **)((long)local_c8._M_unused._0_8_ + 0x18) = index_list;
  *(LocalTableStorage **)((long)local_c8._M_unused._0_8_ + 0x20) = this;
  *(row_t **)((long)local_c8._M_unused._0_8_ + 0x28) = start_row;
  local_b0 = ::std::
             _Function_handler<bool_(duckdb::DataChunk_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/storage/local_storage.cpp:156:45)>
             ::_M_invoke;
  local_b8 = ::std::
             _Function_handler<bool_(duckdb::DataChunk_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/storage/local_storage.cpp:156:45)>
             ::_M_manager;
  RowGroupCollection::Scan
            (local_d8,local_d0,(vector<duckdb::StorageIndex,_true> *)&local_f8,
             (function<bool_(duckdb::DataChunk_&)> *)&local_c8);
  if (local_b8 != (code *)0x0) {
    (*local_b8)(&local_c8,&local_c8,__destroy_functor);
  }
  DataChunk::~DataChunk(&local_a8);
  ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::~vector(&local_f8);
  ::std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_68);
  return __return_storage_ptr__;
}

Assistant:

ErrorData LocalTableStorage::AppendToIndexes(DuckTransaction &transaction, RowGroupCollection &source,
                                             TableIndexList &index_list, const vector<LogicalType> &table_types,
                                             row_t &start_row) {
	// only need to scan for index append
	// figure out which columns we need to scan for the set of indexes
	auto index_columns = index_list.GetRequiredColumns();
	vector<StorageIndex> required_columns;
	for (auto &col : index_columns) {
		required_columns.emplace_back(col);
	}
	// create an empty mock chunk that contains all the correct types for the table
	DataChunk mock_chunk;
	mock_chunk.InitializeEmpty(table_types);
	ErrorData error;
	source.Scan(transaction, required_columns, [&](DataChunk &chunk) -> bool {
		// construct the mock chunk by referencing the required columns
		for (idx_t i = 0; i < required_columns.size(); i++) {
			auto col_id = required_columns[i].GetPrimaryIndex();
			mock_chunk.data[col_id].Reference(chunk.data[i]);
		}
		mock_chunk.SetCardinality(chunk);
		// append this chunk to the indexes of the table
		error = DataTable::AppendToIndexes(index_list, delete_indexes, mock_chunk, start_row, index_append_mode);
		if (error.HasError()) {
			return false;
		}
		start_row += UnsafeNumericCast<row_t>(chunk.size());
		return true;
	});
	return error;
}